

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall
QMessageBoxDetailsText::QMessageBoxDetailsText(QMessageBoxDetailsText *this,QWidget *parent)

{
  QLayout *this_00;
  QWidget *pQVar1;
  long in_FS_OFFSET;
  undefined1 local_50 [8];
  QMargins local_48;
  QWidgetData *local_30;
  
  local_30 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  QWidget::QWidget(&this->super_QWidget,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007de8e8;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QMessageBoxDetailsText_007dea98;
  this->copyAvailable = false;
  this_00 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00);
  local_48.m_left.m_i = 0;
  local_48.m_top.m_i = 0;
  local_48.m_right.m_i = 0;
  local_48.m_bottom.m_i = 0;
  QLayout::setContentsMargins(this_00,&local_48);
  pQVar1 = (QWidget *)operator_new(0x28);
  QFrame::QFrame((QFrame *)pQVar1,&this->super_QWidget,(WindowFlags)0x0);
  QFrame::setFrameShape((QFrame *)pQVar1,HLine);
  QFrame::setFrameShadow((QFrame *)pQVar1,Sunken);
  QBoxLayout::addWidget((QBoxLayout *)this_00,pQVar1,0,(Alignment)0x0);
  pQVar1 = (QWidget *)operator_new(0x28);
  TextEdit::TextEdit((TextEdit *)pQVar1,(QWidget *)0x0);
  this->textEdit = (TextEdit *)pQVar1;
  QWidget::setFixedHeight(pQVar1,100);
  QWidget::setFocusPolicy((QWidget *)this->textEdit,NoFocus);
  QTextEdit::setReadOnly(&this->textEdit->super_QTextEdit,true);
  QBoxLayout::addWidget((QBoxLayout *)this_00,(QWidget *)this->textEdit,0,(Alignment)0x0);
  QWidget::setLayout(&this->super_QWidget,this_00);
  local_48._0_8_ = textCopyAvailable;
  local_48.m_right.m_i = 0;
  local_48.m_bottom.m_i = 0;
  QObject::connect<void(QTextEdit::*)(bool),void(QMessageBoxDetailsText::*)(bool)>
            ((Object *)local_50,(offset_in_QTextEdit_to_subr)this->textEdit,
             (ContextType *)QTextEdit::copyAvailable,(offset_in_QMessageBoxDetailsText_to_subr *)0x0
             ,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMessageBoxDetailsText(QWidget *parent=nullptr)
        : QWidget(parent)
        , copyAvailable(false)
    {
        QVBoxLayout *layout = new QVBoxLayout;
        layout->setContentsMargins(QMargins());
        QFrame *line = new QFrame(this);
        line->setFrameShape(QFrame::HLine);
        line->setFrameShadow(QFrame::Sunken);
        layout->addWidget(line);
        textEdit = new TextEdit();
        textEdit->setFixedHeight(100);
        textEdit->setFocusPolicy(Qt::NoFocus);
        textEdit->setReadOnly(true);
        layout->addWidget(textEdit);
        setLayout(layout);

        connect(textEdit, &TextEdit::copyAvailable,
                this, &QMessageBoxDetailsText::textCopyAvailable);
    }